

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionBody::OnFullJitDequeued(FunctionBody *this,FunctionEntryPointInfo *entryPointInfo)

{
  Type *this_00;
  code *pcVar1;
  ExecutionMode EVar2;
  bool bVar3;
  undefined4 *puVar4;
  FunctionEntryPointInfo *pFVar5;
  
  this_00 = &this->executionState;
  FunctionExecutionStateMachine::AssertIsInitialized(this_00);
  EVar2 = FunctionExecutionStateMachine::GetExecutionMode(this_00);
  if (EVar2 != FullJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1ba4,"(GetExecutionMode() == ExecutionMode::FullJit)",
                                "GetExecutionMode() == ExecutionMode::FullJit");
    if (!bVar3) goto LAB_0076face;
    *puVar4 = 0;
  }
  if (entryPointInfo == (FunctionEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1ba5,"(entryPointInfo)","entryPointInfo");
    if (!bVar3) {
LAB_0076face:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pFVar5 = GetDefaultFunctionEntryPointInfo(this);
  if (pFVar5 != entryPointInfo) {
    return;
  }
  FunctionExecutionStateMachine::SetFullJitRequeueThreshold(this_00,0x19);
  return;
}

Assistant:

void FunctionBody::OnFullJitDequeued(const FunctionEntryPointInfo *const entryPointInfo)
    {
        executionState.AssertIsInitialized();
        Assert(GetExecutionMode() == ExecutionMode::FullJit);
        Assert(entryPointInfo);

        if(entryPointInfo != GetDefaultFunctionEntryPointInfo())
        {
            return;
        }

        // Re-queue the full JIT work item after this many iterations
        executionState.SetFullJitRequeueThreshold(static_cast<uint16>(DEFAULT_CONFIG_FullJitRequeueThreshold));
    }